

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::InlinePolymorphicFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,
          ProfileId profileId,bool *pIsInlined,uint recursiveInlineDepth,bool triedUsingFixedMethods
          )

{
  Instr *instrNext_00;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  ArgSlot AVar4;
  uint uVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  StackSym *pSVar8;
  Instr *this_00;
  PropertySymOpnd *pPVar9;
  FunctionJITTimeInfo *pFVar10;
  FunctionJITTimeInfo *pFVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  SymOpnd *pSVar17;
  ScriptContext *pSVar18;
  ThreadContext *this_01;
  undefined4 *puVar19;
  LabelInstr *doneLabel_00;
  LabelInstr *instr;
  LabelInstr *branchTarget;
  FunctionJITRuntimeInfo *inlineeRuntimeData;
  IndirOpnd *src1Opnd;
  intptr_t address;
  AddrOpnd *src2Opnd;
  BranchInstr *instr_00;
  RegOpnd *functionObject;
  LabelInstr *inlineeStartLabel;
  uint i_1;
  Instr *dispatchStartLabel;
  LabelInstr *doneLabel;
  RegOpnd *pRStack_160;
  RegSlot returnRegSlot;
  RegOpnd *returnValueOpnd;
  JITTimeFunctionBody *inlineeFunctionBody;
  uint i;
  uint inlineeCount;
  FunctionJITTimeInfo *inlineesDataArray [4];
  char16 debugStringBuffer2 [42];
  wchar local_c8 [4];
  char16 debugStringBuffer [42];
  FunctionJITTimeInfo *inlineeJitTimeData;
  Instr *ldMethodFldInstr;
  Instr *instrNext;
  bool triedUsingFixedMethods_local;
  bool *pIsInlined_local;
  ProfileId profileId_local;
  StackSym *symCallerThis_local;
  FunctionJITTimeInfo *inlinerData_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  instrNext_00 = callInstr->m_next;
  *pIsInlined = false;
  if (triedUsingFixedMethods) {
    pOVar6 = IR::Instr::GetSrc1(callInstr);
    pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
    pSVar8 = Sym::AsStackSym(&pRVar7->m_sym->super_Sym);
    bVar2 = StackSym::IsSingleDef(pSVar8);
    if (bVar2) {
      pOVar6 = IR::Instr::GetSrc1(callInstr);
      pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
      pSVar8 = Sym::AsStackSym(&pRVar7->m_sym->super_Sym);
      this_00 = StackSym::GetInstrDef(pSVar8);
      pOVar6 = IR::Instr::GetSrc1(this_00);
      bVar2 = IR::Opnd::IsSymOpnd(pOVar6);
      if (bVar2) {
        pOVar6 = IR::Instr::GetSrc1(this_00);
        pSVar17 = IR::Opnd::AsSymOpnd(pOVar6);
        bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar17);
        if (bVar2) {
          pOVar6 = IR::Instr::GetSrc1(this_00);
          pPVar9 = IR::Opnd::AsPropertySymOpnd(pOVar6);
          TryResetObjTypeSpecFldInfoOn(this,pPVar9);
          pOVar6 = IR::Instr::GetSrc1(this_00);
          pPVar9 = IR::Opnd::AsPropertySymOpnd(pOVar6);
          TryDisableRuntimePolymorphicCacheOn(this,pPVar9);
        }
      }
    }
  }
  pFVar10 = FunctionJITTimeInfo::GetInlinee(inlinerData,profileId);
  if (!triedUsingFixedMethods) {
    pFVar11 = FunctionJITTimeInfo::GetNext(pFVar10);
    if (pFVar11 == (FunctionJITTimeInfo *)0x0) {
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
      if (!bVar2) {
        return instrNext_00;
      }
      pJVar12 = FunctionJITTimeInfo::GetBody(pFVar10);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])local_c8);
      pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                          (inlinerData,(wchar (*) [42])(inlineesDataArray + 3));
      Output::Print(L"INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                    ,pcVar13,pcVar14,pcVar15,pcVar16);
      Output::Flush();
      return instrNext_00;
    }
    pOVar6 = IR::Instr::GetSrc2(callInstr);
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetSrc2(callInstr);
      bVar2 = IR::Opnd::IsSymOpnd(pOVar6);
      if (bVar2) {
        pOVar6 = IR::Instr::GetSrc2(callInstr);
        pSVar17 = IR::Opnd::AsSymOpnd(pOVar6);
        pSVar8 = Sym::AsStackSym(pSVar17->m_sym);
        AVar4 = StackSym::GetArgSlotNum(pSVar8);
        if (0xf < AVar4) {
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
          if (!bVar2) {
            return instrNext_00;
          }
          pJVar12 = FunctionJITTimeInfo::GetBody(pFVar10);
          pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
          pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])local_c8);
          pOVar6 = IR::Instr::GetSrc2(callInstr);
          pSVar17 = IR::Opnd::AsSymOpnd(pOVar6);
          pSVar8 = Sym::AsStackSym(pSVar17->m_sym);
          AVar4 = StackSym::GetArgSlotNum(pSVar8);
          pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
          pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
          pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                              (inlinerData,(wchar (*) [42])(inlineesDataArray + 3));
          Output::Print(L"INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                        ,pcVar13,pcVar14,(ulong)AVar4,0xf,pcVar15,pcVar16);
          Output::Flush();
          return instrNext_00;
        }
      }
    }
  }
  memset(&i,0,0x20);
  uVar5 = FillInlineesDataArray(this,pFVar10,(FunctionJITTimeInfo **)&i,4);
  if ((uVar5 < 2) || (4 < uVar5)) {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
    if (bVar2) {
      pJVar12 = FunctionJITTimeInfo::GetBody(pFVar10);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])local_c8);
      pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                          (inlinerData,(wchar (*) [42])(inlineesDataArray + 3));
      Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                    ,(ulong)uVar5,4,pcVar13,pcVar14,pcVar15,pcVar16);
      Output::Flush();
    }
  }
  else {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
    if (bVar2) {
      Output::Print(L"------------------------------------------------\n");
      Output::Flush();
    }
    for (inlineeFunctionBody._0_4_ = 0; (uint)inlineeFunctionBody < uVar5;
        inlineeFunctionBody._0_4_ = (uint)inlineeFunctionBody + 1) {
      pJVar12 = FunctionJITTimeInfo::GetBody
                          (*(FunctionJITTimeInfo **)(&i + (ulong)(uint)inlineeFunctionBody * 2));
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
      if (bVar2) {
        pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                            (*(FunctionJITTimeInfo **)(&i + (ulong)(uint)inlineeFunctionBody * 2),
                             (wchar (*) [42])local_c8);
        pJVar12 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                            (inlinerData,(wchar (*) [42])(inlineesDataArray + 3));
        Output::Print(L"INLINING (Polymorphic): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                      ,pcVar13,pcVar14,pcVar15,pcVar16);
        Output::Flush();
      }
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,PolymorphicInlinePhase);
    if (bVar2) {
      Output::Print(L"------------------------------------------------\n");
      Output::Flush();
    }
    *pIsInlined = true;
    bVar2 = Func::IsBackgroundJIT(this->topFunc);
    if (!bVar2) {
      pSVar18 = Func::GetScriptContext(this->topFunc);
      this_01 = Js::ScriptContext::GetThreadContext(pSVar18);
      pSVar18 = Func::GetScriptContext(this->topFunc);
      ThreadContext::ProbeStackNoDispose(this_01,0xc00,pSVar18,(PVOID)0x0);
    }
    pOVar6 = IR::Instr::GetDst(callInstr);
    if (pOVar6 == (Opnd *)0x0) {
      pRStack_160 = (RegOpnd *)0x0;
    }
    else {
      pOVar6 = IR::Instr::UnlinkDst(callInstr);
      pRStack_160 = IR::Opnd::AsRegOpnd(pOVar6);
      StackSym::GetByteCodeRegSlot(pRStack_160->m_sym);
    }
    if (uVar5 < 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar19 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x4d6,"(inlineeCount >= 2)","inlineeCount >= 2");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar19 = 0;
    }
    InsertJsFunctionCheck(this,callInstr,callInstr,BailOutOnPolymorphicInlineFunction);
    IR::Instr::MoveArgs(callInstr,true);
    doneLabel_00 = IR::LabelInstr::New(Label,callInstr->m_func,false);
    instr = IR::LabelInstr::New(Label,callInstr->m_func,false);
    IR::Instr::InsertBefore(callInstr,&instr->super_Instr);
    for (inlineeStartLabel._4_4_ = 0; inlineeStartLabel._4_4_ < uVar5;
        inlineeStartLabel._4_4_ = inlineeStartLabel._4_4_ + 1) {
      branchTarget = IR::LabelInstr::New(Label,callInstr->m_func,false);
      IR::Instr::InsertBefore(callInstr,&branchTarget->super_Instr);
      pOVar6 = IR::Instr::GetSrc1(callInstr);
      pFVar10 = *(FunctionJITTimeInfo **)(&i + (ulong)inlineeStartLabel._4_4_ * 2);
      inlineeRuntimeData =
           FunctionJITTimeInfo::GetRuntimeInfo
                     (*(FunctionJITTimeInfo **)(&i + (ulong)inlineeStartLabel._4_4_ * 2));
      InsertOneInlinee(this,callInstr,pRStack_160,pOVar6,pFVar10,inlineeRuntimeData,doneLabel_00,
                       symCallerThis,false,recursiveInlineDepth);
      pOVar6 = IR::Instr::GetSrc1(callInstr);
      pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
      bVar3 = Js::JavascriptFunction::GetOffsetOfFunctionInfo();
      src1Opnd = IR::IndirOpnd::New(pRVar7,(uint)bVar3,TyUint64,(instr->super_Instr).m_func,false);
      address = FunctionJITTimeInfo::GetFunctionInfoAddr
                          (*(FunctionJITTimeInfo **)(&i + (ulong)inlineeStartLabel._4_4_ * 2));
      src2Opnd = IR::AddrOpnd::New(address,AddrOpndKindDynamicFunctionInfo,
                                   (instr->super_Instr).m_func,false,(Var)0x0);
      instr_00 = IR::BranchInstr::New
                           (BrAddr_A,branchTarget,&src1Opnd->super_Opnd,&src2Opnd->super_Opnd,
                            (instr->super_Instr).m_func);
      IR::Instr::InsertBefore(&instr->super_Instr,&instr_00->super_Instr);
    }
    CompletePolymorphicInlining
              (this,callInstr,pRStack_160,doneLabel_00,&instr->super_Instr,(Instr *)0x0,
               BailOutOnPolymorphicInlineFunction);
    Func::SetHasInlinee(this->topFunc);
    InsertStatementBoundary(this,instrNext_00);
  }
  return instrNext_00;
}

Assistant:

IR::Instr *
Inline::InlinePolymorphicFunction(IR::Instr *callInstr, const FunctionJITTimeInfo * inlinerData, const StackSym *symCallerThis, const Js::ProfileId profileId, bool* pIsInlined, uint recursiveInlineDepth, bool triedUsingFixedMethods)
{
    IR::Instr* instrNext = callInstr->m_next;
    *pIsInlined = false;


    if (triedUsingFixedMethods)
    {
        if (callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym()->IsSingleDef())
        {
            IR::Instr* ldMethodFldInstr = callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym()->GetInstrDef();
            if (ldMethodFldInstr->GetSrc1()->IsSymOpnd() && ldMethodFldInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
            {
                TryResetObjTypeSpecFldInfoOn(ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd());
                TryDisableRuntimePolymorphicCacheOn(ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd());
            }
        }
    }

    const FunctionJITTimeInfo * inlineeJitTimeData = inlinerData->GetInlinee(profileId);
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (!triedUsingFixedMethods) // We would have done the following two checks when we tried to inline using fixed methods
    {
        if(!inlineeJitTimeData->GetNext())
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                     inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

            //There are no multiple codegen jit-time data allocated for this call site, not sure how is this possible, abort
            return instrNext;
        }

        if (callInstr->GetSrc2() &&
            callInstr->GetSrc2()->IsSymOpnd() &&
            callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
        {
            // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
            // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
            // data matching does not take into account some types of changes to source code. Need to check this again with current
            // information.
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
                inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer) , callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
                Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

            return instrNext;
        }
    }

    const FunctionJITTimeInfo * inlineesDataArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

    uint inlineeCount = FillInlineesDataArray(inlineeJitTimeData, inlineesDataArray, Js::DynamicProfileInfo::maxPolymorphicInliningSize);
    if (inlineeCount < 2 || inlineeCount > Js::DynamicProfileInfo::maxPolymorphicInliningSize)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        return instrNext;
    }

    // Begin inlining.
    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));
    for (uint i = 0; i < inlineeCount; i++)
    {
        __analysis_assert(inlineesDataArray[i] != nullptr);
        JITTimeFunctionBody *inlineeFunctionBody = inlineesDataArray[i]->GetBody();
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeFunctionBody->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
    }
    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));

    *pIsInlined = true;

    // This function is recursive, so when jitting in the foreground, probe the stack
    if (!this->topFunc->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(this->topFunc->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    Assert(inlineeCount >= 2);

    // Shared bailout point for all the guard check bailouts.
    InsertJsFunctionCheck(callInstr, callInstr, IR::BailOutOnPolymorphicInlineFunction);

    callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    IR::Instr* dispatchStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    callInstr->InsertBefore(dispatchStartLabel);
    for (uint i = 0; i < inlineeCount; i++)
    {
        IR::LabelInstr* inlineeStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func);
        callInstr->InsertBefore(inlineeStartLabel);
        InsertOneInlinee(callInstr, returnValueOpnd, callInstr->GetSrc1(), inlineesDataArray[i], inlineesDataArray[i]->GetRuntimeInfo(), doneLabel, symCallerThis, /*fixedFunctionSafeThis*/ false, recursiveInlineDepth);

        IR::RegOpnd* functionObject = callInstr->GetSrc1()->AsRegOpnd();
        dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel,
            IR::IndirOpnd::New(functionObject, Js::JavascriptFunction::GetOffsetOfFunctionInfo(), TyMachPtr, dispatchStartLabel->m_func),
            IR::AddrOpnd::New(inlineesDataArray[i]->GetFunctionInfoAddr(), IR::AddrOpndKindDynamicFunctionInfo, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
    }

    CompletePolymorphicInlining(callInstr, returnValueOpnd, doneLabel, dispatchStartLabel, /*ldMethodFldInstr*/nullptr, IR::BailOutOnPolymorphicInlineFunction);

    this->topFunc->SetHasInlinee();
    InsertStatementBoundary(instrNext);

    return instrNext;

}